

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.h
# Opt level: O2

void __thiscall
VmFunction::VmFunction
          (VmFunction *this,Allocator *allocator,VmType type,SynBase *source,FunctionData *function,
          ScopeData *scope,VmType returnType)

{
  VmValue::VmValue(&this->super_VmValue,4,allocator,type,source);
  (this->super_VmValue)._vptr_VmValue = (_func_int **)&PTR__VmFunction_00241d70;
  this->function = function;
  this->scope = scope;
  (this->returnType).type = returnType.type;
  (this->returnType).size = returnType.size;
  (this->returnType).structType = returnType.structType;
  (this->allocas).allocator = allocator;
  (this->allocas).data = (this->allocas).little;
  (this->allocas).count = 0;
  (this->allocas).max = 4;
  (this->restoreBlocks).allocator = allocator;
  (this->restoreBlocks).data = (this->restoreBlocks).little;
  (this->restoreBlocks).count = 0;
  (this->restoreBlocks).max = 4;
  this->firstBlock = (VmBlock *)0x0;
  this->lastBlock = (VmBlock *)0x0;
  this->nextBlockId = 1;
  this->nextInstructionId = 1;
  this->next = (VmFunction *)0x0;
  *(undefined4 *)((long)&this->next + 7) = 0;
  this->vmAddress = 0xffffffff;
  this->vmCodeSize = 0;
  this->regVmAddress = 0xffffffff;
  this->regVmCodeSize = 0;
  this->regVmRegisters = 0;
  this->nextRestoreBlock = 0;
  this->nextColor = 0;
  this->nextSearchMarker = 1;
  return;
}

Assistant:

VmFunction(Allocator *allocator, VmType type, SynBase *source, FunctionData *function, ScopeData *scope, VmType returnType): VmValue(myTypeID, allocator, type, source), function(function), scope(scope), returnType(returnType), allocas(allocator), restoreBlocks(allocator)
	{
		firstBlock = NULL;
		lastBlock = NULL;

		nextBlockId = 1;
		nextInstructionId = 1;

		next = NULL;
		listed = false;

		checkedInline = false;
		canInline = false;

		vmAddress = ~0u;
		vmCodeSize = 0;

		regVmAddress = ~0u;
		regVmCodeSize = 0;
		regVmRegisters = 0;

		nextRestoreBlock = 0;

		nextColor = 0;
		nextSearchMarker = 1;
	}